

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_qcx(opj_j2k_t *j2k,int compno)

{
  opj_cio_t *cio_00;
  int in_ESI;
  long in_RDI;
  opj_cio_t *cio;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  int mant;
  int expn;
  int numbands;
  int bandno;
  int in_stack_ffffffffffffffbc;
  int iVar1;
  int n;
  unsigned_long_long v;
  int local_10;
  
  cio_00 = (opj_cio_t *)
           (*(long *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x80) +
                      (long)*(int *)(in_RDI + 0xc) * 0x15e8 + 0x15e0) + (long)in_ESI * 0x438);
  v = *(unsigned_long_long *)(in_RDI + 0x70);
  cio_write(cio_00,v,in_stack_ffffffffffffffbc);
  if (cio_00->length == 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = *(int *)((long)&cio_00->cinfo + 4) * 3 + -2;
  }
  n = iVar1;
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    if (cio_00->length == 0) {
      cio_write(cio_00,v,n);
    }
    else {
      cio_write(cio_00,v,n);
    }
  }
  return;
}

Assistant:

static void j2k_write_qcx(opj_j2k_t *j2k, int compno) {
	int bandno, numbands;
	int expn, mant;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[compno];
	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, tccp->qntsty + (tccp->numgbits << 5), 1);	/* Sqcx */
	numbands = tccp->qntsty == J2K_CCP_QNTSTY_SIQNT ? 1 : tccp->numresolutions * 3 - 2;
	
	for (bandno = 0; bandno < numbands; bandno++) {
		expn = tccp->stepsizes[bandno].expn;
		mant = tccp->stepsizes[bandno].mant;
		
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			cio_write(cio, expn << 3, 1);	/* SPqcx_i */
		} else {
			cio_write(cio, (expn << 11) + mant, 2);	/* SPqcx_i */
		}
	}
}